

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

int recursiveDetectTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  
  nb_tests = nb_tests + 1;
  plVar2 = (long *)xmlNewParserCtxt();
  if ((options & 1U) != 0) {
    lVar3 = *plVar2;
    *(undefined8 *)(lVar3 + 200) = 0;
    *(undefined8 *)(lVar3 + 0x70) = 0;
    *(undefined8 *)(lVar3 + 0x78) = 0;
    *(undefined8 *)(lVar3 + 0x88) = 0;
    *(undefined8 *)(lVar3 + 0x90) = 0;
    *(undefined8 *)(lVar3 + 0x98) = 0;
    *(undefined8 *)(lVar3 + 0xa0) = 0;
    *(undefined8 *)(lVar3 + 0xe8) = 0;
    *(undefined8 *)(lVar3 + 0xf0) = 0;
  }
  lVar3 = xmlCtxtReadFile(plVar2,filename,0,options & 2U ^ 0x32);
  if ((lVar3 == 0) && (*(int *)((long)plVar2 + 0x25c) == 0x72)) {
    xmlFreeParserCtxt(plVar2);
    iVar1 = 0;
  }
  else {
    fprintf(_stderr,"Failed to detect recursion in %s\n",filename);
    xmlFreeParserCtxt(plVar2);
    xmlFreeDoc(lVar3);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
recursiveDetectTest(const char *filename,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlDocPtr doc;
    xmlParserCtxtPtr ctxt;
    int res = 0;
    /*
     * XML_PARSE_DTDVALID is the only way to load external entities
     * without XML_PARSE_NOENT. The validation result doesn't matter
     * anyway.
     */
    int parserOptions = XML_PARSE_DTDVALID | XML_PARSE_NOERROR;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    if (options & OPT_SAX)
        initSAX(ctxt);
    if ((options & OPT_NO_SUBST) == 0)
        parserOptions |= XML_PARSE_NOENT;
    /*
     * base of the test, parse with the old API
     */
    doc = xmlCtxtReadFile(ctxt, filename, NULL, parserOptions);
    if ((doc != NULL) || (ctxt->lastError.code != XML_ERR_RESOURCE_LIMIT)) {
        fprintf(stderr, "Failed to detect recursion in %s\n", filename);
	xmlFreeParserCtxt(ctxt);
	xmlFreeDoc(doc);
        return(1);
    }
    xmlFreeParserCtxt(ctxt);

    return(res);
}